

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

Message * __thiscall google::protobuf::DynamicMessage::New(DynamicMessage *this,Arena *arena)

{
  DynamicMessage *this_00;
  TypeInfo *pTVar1;
  ulong uVar2;
  
  uVar2 = (ulong)this->type_info_->size;
  if (arena == (Arena *)0x0) {
    this_00 = (DynamicMessage *)operator_new(uVar2);
    pTVar1 = this->type_info_;
    arena = (Arena *)0x0;
    memset(this_00,0,(long)pTVar1->size);
  }
  else {
    uVar2 = uVar2 + 7 & 0xfffffffffffffff8;
    if (arena->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation(arena,(type_info *)&char::typeinfo,uVar2);
    }
    this_00 = (DynamicMessage *)internal::ArenaImpl::AllocateAligned(&arena->impl_,uVar2);
    memset(this_00,0,(long)this->type_info_->size);
    pTVar1 = this->type_info_;
  }
  (this_00->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_0067eb50;
  this_00->type_info_ = pTVar1;
  this_00->arena_ = arena;
  (this_00->cached_byte_size_).super___atomic_base<int>._M_i = 0;
  SharedCtor(this_00,true);
  return &this_00->super_Message;
}

Assistant:

Message* DynamicMessage::New(Arena* arena) const {
  if (arena != NULL) {
    void* new_base = Arena::CreateArray<char>(arena, type_info_->size);
    memset(new_base, 0, type_info_->size);
    return new (new_base) DynamicMessage(type_info_, arena);
  } else {
    void* new_base = operator new(type_info_->size);
    memset(new_base, 0, type_info_->size);
    return new (new_base) DynamicMessage(type_info_);
  }
}